

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O3

void __thiscall PCCompatible::KeyboardController::run_for(KeyboardController *this,Cycles cycles)

{
  int iVar1;
  pointer puVar2;
  WrappedInt<Cycles> WVar3;
  int iVar4;
  
  iVar1 = this->reset_delay_;
  if (0 < iVar1) {
    WVar3.length_ = 0x7fffffff;
    if ((long)cycles.super_WrappedInt<Cycles>.length_ < 0x7fffffff) {
      WVar3 = cycles.super_WrappedInt<Cycles>.length_;
    }
    iVar4 = -0x80000000;
    if (-0x80000000 < WVar3.length_) {
      iVar4 = (int)WVar3.length_;
    }
    this->reset_delay_ = iVar1 - iVar4;
    if (iVar1 - iVar4 == 0 || iVar1 < iVar4) {
      puVar2 = (this->input_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->input_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->input_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      post(this,0xaa);
      return;
    }
  }
  return;
}

Assistant:

void run_for(Cycles cycles) {
			if(reset_delay_ <= 0) {
				return;
			}
			reset_delay_ -= cycles.as<int>();
			if(reset_delay_ <= 0) {
				input_.clear();
				post(0xaa);
			}
		}